

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O1

void timer_tick(int cpu_cyc)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (bus->num_active_timers != '\0') {
    uVar5 = 0;
    do {
      bVar1 = bus->TMACTIVE[uVar5];
      if ((bus->TMSTART[bVar1] == true) && (uVar2 = bus->TMCNT_H[bVar1].raw, (uVar2 & 4) == 0)) {
        uVar3 = bus->TMINT[bVar1].ticks + (short)cpu_cyc;
        bus->TMINT[bVar1].ticks = uVar3;
        uVar4 = (ulong)((uVar2 & 3) << 2);
        timer_inc((uint)bVar1,(uint)(uVar3 >> (*(byte *)((long)timer_shift + uVar4) & 0x1f)),
                  (uint)uVar3 & *(uint *)((long)timer_mask + uVar4));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < bus->num_active_timers);
  }
  return;
}

Assistant:

void timer_tick(int cpu_cyc) {
    for (int i = 0; i < bus->num_active_timers; i++) {
        int n = bus->TMACTIVE[i];
        if (bus->TMSTART[n] && !bus->TMCNT_H[n].cascade) {
            bus->TMINT[n].ticks += cpu_cyc;
            word clocks = bus->TMINT[n].ticks >> timer_shift[bus->TMCNT_H[n].frequency];
            word remain = bus->TMINT[n].ticks & timer_mask[bus->TMCNT_H[n].frequency];
            timer_inc(n, clocks, remain);
        }
    }
}